

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O0

void __thiscall FTOutline::cubicTo(FTOutline *this,VPointF *cp1,VPointF *cp2,VPointF ep)

{
  SW_FT_Pos SVar1;
  VPointF *in_RDX;
  VPointF *in_RSI;
  FTOutline *in_RDI;
  float fVar2;
  VPointF local_8;
  
  fVar2 = VPointF::x(in_RSI);
  SVar1 = TO_FT_COORD(in_RDI,fVar2);
  (in_RDI->ft).points[(in_RDI->ft).n_points].x = SVar1;
  fVar2 = VPointF::y(in_RSI);
  SVar1 = TO_FT_COORD(in_RDI,fVar2);
  (in_RDI->ft).points[(in_RDI->ft).n_points].y = SVar1;
  (in_RDI->ft).tags[(in_RDI->ft).n_points] = '\x02';
  (in_RDI->ft).n_points = (in_RDI->ft).n_points + 1;
  fVar2 = VPointF::x(in_RDX);
  SVar1 = TO_FT_COORD(in_RDI,fVar2);
  (in_RDI->ft).points[(in_RDI->ft).n_points].x = SVar1;
  fVar2 = VPointF::y(in_RDX);
  SVar1 = TO_FT_COORD(in_RDI,fVar2);
  (in_RDI->ft).points[(in_RDI->ft).n_points].y = SVar1;
  (in_RDI->ft).tags[(in_RDI->ft).n_points] = '\x02';
  (in_RDI->ft).n_points = (in_RDI->ft).n_points + 1;
  fVar2 = VPointF::x(&local_8);
  SVar1 = TO_FT_COORD(in_RDI,fVar2);
  (in_RDI->ft).points[(in_RDI->ft).n_points].x = SVar1;
  fVar2 = VPointF::y(&local_8);
  SVar1 = TO_FT_COORD(in_RDI,fVar2);
  (in_RDI->ft).points[(in_RDI->ft).n_points].y = SVar1;
  (in_RDI->ft).tags[(in_RDI->ft).n_points] = '\x01';
  (in_RDI->ft).n_points = (in_RDI->ft).n_points + 1;
  return;
}

Assistant:

void FTOutline::cubicTo(const VPointF &cp1, const VPointF &cp2,
                        const VPointF ep)
{
    assert(ft.n_points <= SHRT_MAX - 3);

    ft.points[ft.n_points].x = TO_FT_COORD(cp1.x());
    ft.points[ft.n_points].y = TO_FT_COORD(cp1.y());
    ft.tags[ft.n_points] = SW_FT_CURVE_TAG_CUBIC;
    ft.n_points++;

    ft.points[ft.n_points].x = TO_FT_COORD(cp2.x());
    ft.points[ft.n_points].y = TO_FT_COORD(cp2.y());
    ft.tags[ft.n_points] = SW_FT_CURVE_TAG_CUBIC;
    ft.n_points++;

    ft.points[ft.n_points].x = TO_FT_COORD(ep.x());
    ft.points[ft.n_points].y = TO_FT_COORD(ep.y());
    ft.tags[ft.n_points] = SW_FT_CURVE_TAG_ON;
    ft.n_points++;
}